

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_progname.c
# Opt level: O1

char * zt_progname(char *name,int opts)

{
  size_t sVar1;
  char *pcVar2;
  size_t __n;
  
  if ((name != (char *)0x0) && (*name != '\0')) {
    memset(_progname,0,0x1000);
    if (opts != 1) {
      sVar1 = strlen(name);
      __n = 0x1000;
      if (sVar1 < 0x1000) {
        __n = sVar1;
      }
      pcVar2 = (char *)memcpy(_progname,name,__n);
      return pcVar2;
    }
    zt_cstr_basename(_progname,0x1000,name,(char *)0x0);
  }
  return _progname;
}

Assistant:

char *
zt_progname(const char *name, int opts)
{
    if (name && *name != '\0') {
        memset(_progname, '\0', PATH_MAX);
        if (opts == STRIP_DIR) {
            zt_cstr_basename(_progname, PATH_MAX, name, NULL);
        } else {
            memcpy(_progname, name, MIN(PATH_MAX, strlen(name)));
        }
    }
    return _progname;
}